

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::ObjectBase<Diligent::IShaderGL>::QueryInterface
          (ObjectBase<Diligent::IShaderGL> *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface != (IObject **)0x0) {
    *ppInterface = (IObject *)0x0;
    bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)Diligent::IID_Unknown);
    if (bVar1) {
      *ppInterface = (IObject *)this;
      (*(this->super_RefCountedObject<Diligent::IShaderGL>).super_IShaderGL.super_IShader.
        super_IDeviceObject.super_IObject._vptr_IObject[1])(this);
      return;
    }
  }
  return;
}

Assistant:

QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface)
    {
        if (ppInterface == nullptr)
            return;

        *ppInterface = nullptr;
        if (IID == IID_Unknown)
        {
            *ppInterface = this;
            (*ppInterface)->AddRef();
        }
    }